

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,QList<QString>>::
emplaceValue<QList<QString>>
          (Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *this,QList<QString> *args)

{
  long lVar1;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QString>::QList(in_RDI,in_stack_ffffffffffffffb8);
  QList<QString>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  QList<QString>::~QList((QList<QString> *)0x7584ab);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }